

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O2

EStatusCode __thiscall
PDFWriter::ModifyPDF
          (PDFWriter *this,string *inModifiedFile,EPDFVersion inPDFVersion,
          string *inOptionalAlternativeOutputFile,LogConfiguration *inLogConfiguration,
          PDFCreationSettings *inPDFCreationSettings)

{
  OutputFile *this_00;
  __type _Var1;
  EStatusCode EVar2;
  IByteWriterWithPosition *pIVar3;
  IByteWriter *inOutputStream;
  IByteReader *inInputStream;
  bool bVar4;
  OutputStreamTraits traits;
  InputFile modifiedFileInput;
  
  SetupLog(this,inLogConfiguration);
  SetupCreationSettings(this,inPDFCreationSettings);
  if ((inOptionalAlternativeOutputFile->_M_string_length == 0) ||
     (_Var1 = std::operator==(inOptionalAlternativeOutputFile,inModifiedFile), _Var1)) {
    EVar2 = OutputFile::OpenFile(&this->mOutputFile,inModifiedFile,true);
    if (EVar2 != eSuccess) {
      return EVar2;
    }
    pIVar3 = OutputFile::GetOutputStream(&this->mOutputFile);
    ObjectsContext::SetOutputStream(&this->mObjectsContext,pIVar3);
  }
  else {
    this_00 = &this->mOutputFile;
    EVar2 = OutputFile::OpenFile(this_00,inOptionalAlternativeOutputFile,false);
    if (EVar2 != eSuccess) {
      return EVar2;
    }
    InputFile::InputFile(&modifiedFileInput);
    EVar2 = InputFile::OpenFile(&modifiedFileInput,inModifiedFile);
    if (EVar2 == eSuccess) {
      inOutputStream = &OutputFile::GetOutputStream(this_00)->super_IByteWriter;
      OutputStreamTraits::OutputStreamTraits(&traits,inOutputStream);
      inInputStream = &InputFile::GetInputStream(&modifiedFileInput)->super_IByteReader;
      EVar2 = OutputStreamTraits::CopyToOutputStream(&traits,inInputStream);
      bVar4 = EVar2 == eSuccess;
      if (bVar4) {
        pIVar3 = OutputFile::GetOutputStream(this_00);
        ObjectsContext::SetOutputStream(&this->mObjectsContext,pIVar3);
        ObjectsContext::WriteTokenSeparator(&this->mObjectsContext,eTokenSeparatorEndLine);
      }
      OutputStreamTraits::~OutputStreamTraits(&traits);
    }
    else {
      bVar4 = false;
    }
    InputFile::~InputFile(&modifiedFileInput);
    if (!bVar4) {
      return EVar2;
    }
  }
  PDFHummus::DocumentContext::SetOutputFileInformation(&this->mDocumentContext,&this->mOutputFile);
  this->mIsModified = true;
  EVar2 = SetupStateFromModifiedFile(this,inModifiedFile,inPDFVersion,inPDFCreationSettings);
  return EVar2;
}

Assistant:

EStatusCode PDFWriter::ModifyPDF(const std::string& inModifiedFile,
                                            EPDFVersion inPDFVersion,
                                            const std::string& inOptionalAlternativeOutputFile,
                                            const LogConfiguration& inLogConfiguration,
                                            const PDFCreationSettings& inPDFCreationSettings)
{
    EStatusCode status = eSuccess;

    SetupLog(inLogConfiguration);
	SetupCreationSettings(inPDFCreationSettings);

    do
    {
        // either append to original file, or create a new copy and "modify" it. depending on users choice
        if(inOptionalAlternativeOutputFile.size() == 0 || (inOptionalAlternativeOutputFile == inModifiedFile))
        {
            status = mOutputFile.OpenFile(inModifiedFile,true);
            if(status != eSuccess)
                break;
			mObjectsContext.SetOutputStream(mOutputFile.GetOutputStream());
		}
        else
        {
            status = mOutputFile.OpenFile(inOptionalAlternativeOutputFile);
            if(status != eSuccess)
               break;

            // copy original to new output file
            InputFile modifiedFileInput;
            status = modifiedFileInput.OpenFile(inModifiedFile);
            if(status != eSuccess)
                break;

            OutputStreamTraits traits(mOutputFile.GetOutputStream());
            status = traits.CopyToOutputStream(modifiedFileInput.GetInputStream());
            if(status != eSuccess)
                break;

			// add an extra newline after eof, just in case the original file didn't have it
			mObjectsContext.SetOutputStream(mOutputFile.GetOutputStream());
			mObjectsContext.WriteTokenSeparator(eTokenSeparatorEndLine);
        }

        mDocumentContext.SetOutputFileInformation(&mOutputFile);

        // do setup for modification
        mIsModified = true;
        status = SetupStateFromModifiedFile(inModifiedFile, inPDFVersion, inPDFCreationSettings);
    }
    while (false);

    return status;
}